

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::parseAreaLight(SemanticParser *this,SP *in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  char *pcVar7;
  SP SVar8;
  SP diffuse;
  vec2f v;
  string local_68;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  if ((in_RDX._M_pi)->_vptr__Sp_counted_base != (_func_int **)0x0) {
    iVar4 = std::__cxx11::string::compare((char *)((in_RDX._M_pi)->_vptr__Sp_counted_base + 7));
    if (iVar4 == 0) {
      pp_Var2 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
      paVar1 = &local_68.field_2;
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"L","");
      bVar3 = syntactic::ParamSet::hasParam2f((ParamSet *)(pp_Var2 + 1),&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        std::__shared_ptr<pbrt::DiffuseAreaLightBB,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<pbrt::DiffuseAreaLightBB>>
                  ((__shared_ptr<pbrt::DiffuseAreaLightBB,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                   (allocator<pbrt::DiffuseAreaLightBB> *)&local_68);
        pp_Var2 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"L","");
        syntactic::ParamSet::getParam2f((ParamSet *)(pp_Var2 + 1),(float *)&local_38,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        *(undefined8 *)(CONCAT44(uStack_44,local_48) + 0x18) = local_38;
        pp_Var2 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"nsamples","");
        iVar4 = syntactic::ParamSet::getParam1i((ParamSet *)(pp_Var2 + 1),&local_68,1);
        *(int *)(CONCAT44(uStack_44,local_48) + 0x20) = iVar4;
        in_RDX._M_pi = extraout_RDX_00;
      }
      else {
        pp_Var2 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"L","");
        bVar3 = syntactic::ParamSet::hasParam3f((ParamSet *)(pp_Var2 + 1),&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) {
          poVar5 = (ostream *)&std::cout;
          pcVar7 = 
          "Warning: diffuse area light, but no \'L\' parameter, or L is neither two (blackbody) nor three (rgba) floats?! Ignoring."
          ;
          lVar6 = 0x76;
          goto LAB_0013c328;
        }
        std::__shared_ptr<pbrt::DiffuseAreaLightRGB,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<pbrt::DiffuseAreaLightRGB>>
                  ((__shared_ptr<pbrt::DiffuseAreaLightRGB,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                   (allocator<pbrt::DiffuseAreaLightRGB> *)&local_68);
        pp_Var2 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        lVar6 = CONCAT44(uStack_44,local_48);
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"L","");
        syntactic::ParamSet::getParam3f((ParamSet *)(pp_Var2 + 1),(float *)(lVar6 + 0x18),&local_68)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pp_Var2 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"nsamples","");
        iVar4 = syntactic::ParamSet::getParam1i((ParamSet *)(pp_Var2 + 1),&local_68,1);
        *(int *)(CONCAT44(uStack_44,local_48) + 0x24) = iVar4;
        in_RDX._M_pi = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        in_RDX._M_pi = extraout_RDX_02;
      }
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_0013c357;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Warning: unknown area light type \'",0x22);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)(in_RDX._M_pi)->_vptr__Sp_counted_base[7],
                        (long)(in_RDX._M_pi)->_vptr__Sp_counted_base[8]);
    pcVar7 = "\'.";
    lVar6 = 2;
LAB_0013c328:
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,lVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    in_RDX._M_pi = extraout_RDX;
  }
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
LAB_0013c357:
  *(undefined4 *)&(this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_48;
  *(undefined4 *)
   ((long)&(this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
       uStack_44;
  *(undefined4 *)
   &(this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       uStack_40;
  *(undefined4 *)
   ((long)&(this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 4) = uStack_3c;
  SVar8.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  SVar8.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SP)SVar8.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AreaLight::SP SemanticParser::parseAreaLight(pbrt::syntactic::AreaLightSource::SP in)
  {
    if (!in)
      return AreaLight::SP();

    if (in->type == "diffuse") {
      /*! parsing here is a bit more tricky, because the L parameter
          can be either an RGB, or a blackbody. Since the latter has
          two floats to the former's three floats we'll simply switch
          based on parameter count here .... */
      if (in->hasParam2f("L")) {
        DiffuseAreaLightBB::SP diffuse = std::make_shared<DiffuseAreaLightBB>();
        vec2f v;
        in->getParam2f(&v.x,"L");
        diffuse->temperature = v.x;
        diffuse->scale       = v.y;
        diffuse->nSamples = in->getParam1i("nsamples", 1);
        return diffuse;
      } else if (in->hasParam3f("L")) {
        DiffuseAreaLightRGB::SP diffuse = std::make_shared<DiffuseAreaLightRGB>();
        in->getParam3f(&diffuse->L.x,"L");
        diffuse->nSamples = in->getParam1i("nsamples", 1);
        return diffuse;
      } else {
        std::cout << "Warning: diffuse area light, but no 'L' parameter, or L is neither two (blackbody) nor three (rgba) floats?! Ignoring." << std::endl;
        return AreaLight::SP();
      }
      // auto L_it = in->param.find("L");
      // if (L_it == in->param.end()) {
      //   std::cout << "Warning: diffuse area light, but no 'L' parameter?! Ignoring." << std::endl;
      //   return AreaLight::SP();
      // }

      // syntactic::Param::SP param = L_it->second;
      // if (param->getType() == "blackbody") {
      //   // not blackbody - assume it's RGB
      //   DiffuseAreaLightBB::SP diffuse = std::make_shared<DiffuseAreaLightBB>();
        
      //   in->getParam3f(&diffuse->blackBody.x,"L");
      //   return diffuse;
      // } else {
      //   // not blackbody - assume it's RGB
      //   DiffuseAreaLightRGB::SP diffuse = std::make_shared<DiffuseAreaLightRGB>();
      //   in->getParam3f(&diffuse->blackBody.x,"L");
      //   return diffuse;
      // }
      
    }

    std::cout << "Warning: unknown area light type '" << in->type << "'." << std::endl;
    return AreaLight::SP();
  }